

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCopyPixels.cpp
# Opt level: O2

void anon_unknown.dwarf_2a86fa::writeCopyRead
               (string *tempDir,int w,int h,int xs,int ys,int dx,int dy)

{
  half *phVar1;
  float fVar2;
  _Alloc_hider _Var3;
  _Alloc_hider _Var4;
  bool bVar5;
  char cVar6;
  _Rb_tree_color _Var7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  ostream *poVar20;
  int *piVar21;
  undefined4 *puVar22;
  char *pcVar23;
  Header *pHVar24;
  Box<Imath_3_2::Vec2<int>_> *pBVar25;
  Box<Imath_3_2::Vec2<int>_> *pBVar26;
  float *pfVar27;
  float *pfVar28;
  ChannelList *pCVar29;
  ChannelList *pCVar30;
  long lVar31;
  half *phVar32;
  half *phVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  long local_258;
  FrameBuffer fb;
  TiledInputFile in2;
  Array2D<Imath_3_2::half> ph1;
  int local_1c0;
  Array2D<Imath_3_2::half> ph2;
  Array2D<Imath_3_2::half> ph1_1;
  FrameBuffer fb2;
  TiledInputFile in1;
  int local_118;
  Header hdr;
  TiledOutputFile out;
  string filename2;
  string filename1;
  
  std::operator+(&filename1,tempDir,"imf_test_copy1.exr");
  std::operator+(&filename2,tempDir,"imf_test_copy2.exr");
  _Var7 = w + 0xaa;
  iVar8 = h + 0x102;
  lVar18 = (long)-h;
  lVar19 = (long)-w;
  iVar17 = 0;
  do {
    if (iVar17 == 10) {
      std::__cxx11::string::~string((string *)&filename2);
      std::__cxx11::string::~string((string *)&filename1);
      return;
    }
    for (iVar16 = 0; _Var4._M_p = filename1._M_dataplus._M_p,
        _Var3._M_p = filename2._M_dataplus._M_p, iVar16 != 2; iVar16 = iVar16 + 1) {
      poVar20 = std::operator<<((ostream *)&std::cout,"levelMode 0, ");
      poVar20 = std::operator<<(poVar20,"compression ");
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar17);
      poVar20 = std::operator<<(poVar20,", roundingMode ");
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar16);
      poVar20 = std::operator<<(poVar20,", xOffset ");
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,w);
      poVar20 = std::operator<<(poVar20,", yOffset ");
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,h);
      std::endl<char,std::char_traits<char>>(poVar20);
      _out = 0;
      fb2._map._M_t._M_impl._0_8_ = 0;
      fb._map._M_t._M_impl._0_4_ = w;
      fb._map._M_t._M_impl._4_4_ = h;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var7;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = iVar8;
      Imf_3_4::Header::Header
                (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&fb2,1.0,INCREASING_Y,ZIP_COMPRESSION);
      piVar21 = (int *)Imf_3_4::Header::compression();
      *piVar21 = iVar17;
      puVar22 = (undefined4 *)Imf_3_4::Header::lineOrder();
      *puVar22 = 0;
      pcVar23 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar23,(Channel *)0x1a5faf);
      _out = 0x3700000011;
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      ph1._sizeX = 0x103;
      ph1._sizeY = 0xab;
      ph1._data = (half *)operator_new__(0x15a02);
      fillPixels(&ph1,0xab,0x103);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice
                ((Slice *)&out,HALF,(char *)(ph1._data + ph1._sizeY * lVar18 + lVar19),2,0x156,1,1,
                 0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1a5faf);
      std::operator<<((ostream *)&std::cout," writing");
      std::ostream::flush();
      remove(_Var4._M_p);
      iVar9 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile(&out,_Var4._M_p,&hdr,iVar9);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar11 = (int)&out;
      iVar9 = Imf_3_4::TiledOutputFile::numXTiles(iVar11);
      iVar10 = Imf_3_4::TiledOutputFile::numYTiles(iVar11);
      Imf_3_4::TiledOutputFile::writeTiles(iVar11,0,iVar9 + -1,0,iVar10 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile(&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb);
      std::operator<<((ostream *)&std::cout," copying");
      std::ostream::flush();
      remove(_Var3._M_p);
      iVar9 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&out,_Var4._M_p,iVar9);
      pHVar24 = (Header *)Imf_3_4::InputFile::header();
      iVar9 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&fb,_Var3._M_p,pHVar24,iVar9);
      Imf_3_4::TiledOutputFile::copyPixels((InputFile *)&fb);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fb);
      Imf_3_4::InputFile::~InputFile((InputFile *)&out);
      std::operator<<((ostream *)&std::cout," reading");
      std::ostream::flush();
      iVar9 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile(&in1,_Var4._M_p,iVar9);
      iVar9 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile(&in2,_Var3._M_p,iVar9);
      Imf_3_4::TiledInputFile::header();
      piVar21 = (int *)Imf_3_4::Header::dataWindow();
      iVar9 = piVar21[2];
      lVar35 = (long)*piVar21;
      lVar34 = (iVar9 - lVar35) + 1;
      iVar10 = piVar21[1];
      lVar31 = (long)piVar21[3] - (long)iVar10;
      lVar37 = lVar31 + 1;
      Imf_3_4::Array2D<Imath_3_2::half>::Array2D(&ph1_1,lVar37,lVar34);
      Imf_3_4::Array2D<Imath_3_2::half>::Array2D(&ph2,lVar37,lVar34);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb2._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      lVar37 = -(long)iVar10;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice
                ((Slice *)&out,HALF,(char *)(ph1_1._data + (ph1_1._sizeY * lVar37 - lVar35)),2,
                 lVar34 * 2,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1a5faf);
      Imf_3_4::Slice::Slice
                ((Slice *)&out,HALF,(char *)(ph2._data + (lVar37 * ph2._sizeY - lVar35)),2,
                 lVar34 * 2,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb2,(Slice *)0x1a5faf);
      Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&in1);
      iVar10 = Imf_3_4::TiledInputFile::numXTiles((int)&in1);
      iVar11 = Imf_3_4::TiledInputFile::numYTiles((int)&in1);
      Imf_3_4::TiledInputFile::readTiles((int)&in1,0,iVar10 + -1,0,iVar11 + -1);
      Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&in2);
      iVar10 = Imf_3_4::TiledInputFile::numXTiles((int)&in2);
      iVar11 = Imf_3_4::TiledInputFile::numYTiles((int)&in2);
      Imf_3_4::TiledInputFile::readTiles((int)&in2,0,iVar10 + -1,0,iVar11 + -1);
      std::operator<<((ostream *)&std::cout," comparing");
      std::ostream::flush();
      Imf_3_4::TiledInputFile::header();
      pBVar25 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
      pBVar26 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
      bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar25,pBVar26);
      if (!bVar5) {
        __assert_fail("in2.header ().displayWindow () == hdr.displayWindow ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x8d,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pBVar25 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
      pBVar26 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
      bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar25,pBVar26);
      if (!bVar5) {
        __assert_fail("in2.header ().dataWindow () == hdr.dataWindow ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x8e,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pfVar27 = (float *)Imf_3_4::Header::pixelAspectRatio();
      fVar2 = *pfVar27;
      pfVar27 = (float *)Imf_3_4::Header::pixelAspectRatio();
      if ((fVar2 != *pfVar27) || (NAN(fVar2) || NAN(*pfVar27))) {
        __assert_fail("in2.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x8f,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pfVar27 = (float *)Imf_3_4::Header::screenWindowCenter();
      pfVar28 = (float *)Imf_3_4::Header::screenWindowCenter();
      if ((((*pfVar27 != *pfVar28) || (NAN(*pfVar27) || NAN(*pfVar28))) ||
          (pfVar27[1] != pfVar28[1])) || (NAN(pfVar27[1]) || NAN(pfVar28[1]))) {
        __assert_fail("in2.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x91,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pfVar27 = (float *)Imf_3_4::Header::screenWindowWidth();
      fVar2 = *pfVar27;
      pfVar27 = (float *)Imf_3_4::Header::screenWindowWidth();
      if ((fVar2 != *pfVar27) || (NAN(fVar2) || NAN(*pfVar27))) {
        __assert_fail("in2.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x92,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      piVar21 = (int *)Imf_3_4::Header::lineOrder();
      iVar10 = *piVar21;
      piVar21 = (int *)Imf_3_4::Header::lineOrder();
      if (iVar10 != *piVar21) {
        __assert_fail("in2.header ().lineOrder () == hdr.lineOrder ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x93,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      piVar21 = (int *)Imf_3_4::Header::compression();
      iVar10 = *piVar21;
      piVar21 = (int *)Imf_3_4::Header::compression();
      if (iVar10 != *piVar21) {
        __assert_fail("in2.header ().compression () == hdr.compression ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x94,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pCVar29 = (ChannelList *)Imf_3_4::Header::channels();
      pCVar30 = (ChannelList *)Imf_3_4::Header::channels();
      cVar6 = Imf_3_4::ChannelList::operator==(pCVar29,pCVar30);
      if (cVar6 == '\0') {
        __assert_fail("in2.header ().channels () == hdr.channels ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x95,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      local_1c0 = (int)(iVar9 - lVar35);
      local_118 = (int)lVar31;
      phVar32 = ph1_1._data;
      phVar33 = ph2._data;
      for (lVar34 = 0; lVar34 <= local_118; lVar34 = lVar34 + 1) {
        lVar37 = 0;
        while (lVar37 <= local_1c0) {
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar32[lVar37]._h * 4);
          phVar1 = phVar33 + lVar37;
          lVar37 = lVar37 + 1;
          pfVar27 = (float *)(_imath_half_to_float_table + (ulong)phVar1->_h * 4);
          if ((fVar2 != *pfVar27) || (NAN(fVar2) || NAN(*pfVar27))) {
            __assert_fail("ph1[y][x] == ph2[y][x]",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                          ,0x99,
                          "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                         );
          }
        }
        phVar33 = phVar33 + ph2._sizeY;
        phVar32 = phVar32 + ph1_1._sizeY;
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb2);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb);
      Imf_3_4::Array2D<Imath_3_2::half>::~Array2D(&ph2);
      Imf_3_4::Array2D<Imath_3_2::half>::~Array2D(&ph1_1);
      Imf_3_4::TiledInputFile::~TiledInputFile(&in2);
      Imf_3_4::TiledInputFile::~TiledInputFile(&in1);
      remove(_Var4._M_p);
      remove(_Var3._M_p);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      Imf_3_4::Array2D<Imath_3_2::half>::~Array2D(&ph1);
      Imf_3_4::Header::~Header(&hdr);
      _Var4 = filename1._M_dataplus;
      _Var3 = filename2._M_dataplus;
      poVar20 = std::operator<<((ostream *)&std::cout,"levelMode 1, ");
      poVar20 = std::operator<<(poVar20,"compression ");
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar17);
      poVar20 = std::operator<<(poVar20,", roundingMode ");
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar16);
      poVar20 = std::operator<<(poVar20,", xOffset ");
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,w);
      poVar20 = std::operator<<(poVar20,", yOffset ");
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,h);
      std::endl<char,std::char_traits<char>>(poVar20);
      _out = 0;
      fb2._map._M_t._M_impl._0_8_ = 0;
      fb._map._M_t._M_impl._0_4_ = w;
      fb._map._M_t._M_impl._4_4_ = h;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var7;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = iVar8;
      Imf_3_4::Header::Header
                (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&fb2,1.0,INCREASING_Y,ZIP_COMPRESSION);
      piVar21 = (int *)Imf_3_4::Header::compression();
      *piVar21 = iVar17;
      puVar22 = (undefined4 *)Imf_3_4::Header::lineOrder();
      *puVar22 = 0;
      pcVar23 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar23,(Channel *)0x1a5faf);
      _out = 0x3700000011;
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      ph1._sizeX = 0;
      ph1._sizeY = 0;
      std::operator<<((ostream *)&std::cout," writing");
      std::ostream::flush();
      remove(_Var4._M_p);
      iVar9 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&fb2,_Var4._M_p,&hdr,iVar9);
      iVar9 = Imf_3_4::TiledOutputFile::numLevels();
      Imf_3_4::Array<Imf_3_4::Array2D<Imath_3_2::half>_>::resizeErase
                ((Array<Imf_3_4::Array2D<Imath_3_2::half>_> *)&ph1,(long)iVar9);
      lVar34 = 0;
      for (lVar37 = 0; iVar9 = Imf_3_4::TiledOutputFile::numLevels(), lVar37 < iVar9;
          lVar37 = lVar37 + 1) {
        iVar11 = (int)(TiledOutputFile *)&fb2;
        iVar9 = Imf_3_4::TiledOutputFile::levelWidth(iVar11);
        iVar10 = Imf_3_4::TiledOutputFile::levelHeight(iVar11);
        Imf_3_4::Array2D<Imath_3_2::half>::resizeErase
                  ((Array2D<Imath_3_2::half> *)(ph1._sizeY + lVar34),(long)iVar10,(long)iVar9);
        fillPixels((Array2D<Imath_3_2::half> *)(ph1._sizeY + lVar34),iVar9,iVar10);
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        Imf_3_4::Slice::Slice
                  ((Slice *)&out,HALF,
                   (char *)(*(long *)(ph1._sizeY + 8 + lVar34) * lVar18 * 2 +
                            *(long *)(ph1._sizeY + 0x10 + lVar34) + lVar19 * 2),2,(long)iVar9 * 2,1,
                   1,0.0,false,false);
        Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1a5faf);
        Imf_3_4::TiledOutputFile::setFrameBuffer(&fb2);
        iVar9 = Imf_3_4::TiledOutputFile::numXTiles(iVar11);
        iVar10 = Imf_3_4::TiledOutputFile::numYTiles(iVar11);
        Imf_3_4::TiledOutputFile::writeTiles(iVar11,0,iVar9 + -1,0,iVar10 + -1);
        std::
        _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                     *)&fb);
        lVar34 = lVar34 + 0x18;
      }
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fb2);
      std::operator<<((ostream *)&std::cout," copying");
      std::ostream::flush();
      remove(_Var3._M_p);
      iVar9 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&out,_Var4._M_p,iVar9);
      pHVar24 = (Header *)Imf_3_4::InputFile::header();
      iVar9 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&fb,_Var3._M_p,pHVar24,iVar9);
      Imf_3_4::TiledOutputFile::copyPixels((InputFile *)&fb);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fb);
      Imf_3_4::InputFile::~InputFile((InputFile *)&out);
      std::operator<<((ostream *)&std::cout," reading");
      std::ostream::flush();
      iVar9 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile(&in1,_Var4._M_p,iVar9);
      iVar9 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile(&in2,_Var3._M_p,iVar9);
      Imf_3_4::TiledInputFile::header();
      piVar21 = (int *)Imf_3_4::Header::dataWindow();
      iVar9 = *piVar21;
      iVar10 = piVar21[1];
      uVar12 = Imf_3_4::TiledInputFile::numLevels();
      Imf_3_4::Array<Imf_3_4::Array2D<Imath_3_2::half>_>::Array
                ((Array<Imf_3_4::Array2D<Imath_3_2::half>_> *)&ph1_1,(long)(int)uVar12);
      Imf_3_4::Array<Imf_3_4::Array2D<Imath_3_2::half>_>::Array
                ((Array<Imf_3_4::Array2D<Imath_3_2::half>_> *)&ph2,(long)(int)uVar12);
      uVar39 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar39 = 0;
      }
      for (lVar34 = 0; uVar39 * 0x18 != lVar34; lVar34 = lVar34 + 0x18) {
        iVar11 = Imf_3_4::TiledInputFile::levelWidth((int)&in2);
        iVar13 = Imf_3_4::TiledInputFile::levelHeight((int)&in2);
        lVar37 = (long)iVar11;
        Imf_3_4::Array2D<Imath_3_2::half>::resizeErase
                  ((Array2D<Imath_3_2::half> *)(ph1_1._sizeY + lVar34),(long)iVar13,lVar37);
        Imf_3_4::Array2D<Imath_3_2::half>::resizeErase
                  ((Array2D<Imath_3_2::half> *)(ph2._sizeY + lVar34),(long)iVar13,lVar37);
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &fb2._map._M_t._M_impl.super__Rb_tree_header._M_header;
        fb2._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        Imf_3_4::Slice::Slice
                  ((Slice *)&out,HALF,
                   (char *)(*(long *)(ph1_1._sizeY + 8 + lVar34) * -(long)iVar10 * 2 +
                            *(long *)(ph1_1._sizeY + 0x10 + lVar34) + (long)iVar9 * -2),2,lVar37 * 2
                   ,1,1,0.0,false,false);
        Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1a5faf);
        Imf_3_4::Slice::Slice
                  ((Slice *)&out,HALF,
                   (char *)(*(long *)(ph2._sizeY + 8 + lVar34) * -(long)iVar10 * 2 +
                            *(long *)(ph2._sizeY + 0x10 + lVar34) + (long)iVar9 * -2),2,lVar37 * 2,1
                   ,1,0.0,false,false);
        Imf_3_4::FrameBuffer::insert((char *)&fb2,(Slice *)0x1a5faf);
        Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&in1);
        Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&in2);
        iVar11 = Imf_3_4::TiledInputFile::numXTiles((int)&in1);
        iVar13 = Imf_3_4::TiledInputFile::numYTiles((int)&in1);
        Imf_3_4::TiledInputFile::readTiles((int)&in1,0,iVar11 + -1,0,iVar13 + -1);
        iVar11 = Imf_3_4::TiledInputFile::numXTiles((int)&in2);
        iVar13 = Imf_3_4::TiledInputFile::numYTiles((int)&in2);
        Imf_3_4::TiledInputFile::readTiles((int)&in2,0,iVar11 + -1,0,iVar13 + -1);
        std::
        _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                     *)&fb2);
        std::
        _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                     *)&fb);
      }
      std::operator<<((ostream *)&std::cout," comparing");
      std::ostream::flush();
      Imf_3_4::TiledInputFile::header();
      pBVar25 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
      pBVar26 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
      bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar25,pBVar26);
      if (!bVar5) {
        __assert_fail("in2.header ().displayWindow () == hdr.displayWindow ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,300,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pBVar25 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
      pBVar26 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
      bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar25,pBVar26);
      if (!bVar5) {
        __assert_fail("in2.header ().dataWindow () == hdr.dataWindow ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x12d,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pfVar27 = (float *)Imf_3_4::Header::pixelAspectRatio();
      fVar2 = *pfVar27;
      pfVar27 = (float *)Imf_3_4::Header::pixelAspectRatio();
      if ((fVar2 != *pfVar27) || (NAN(fVar2) || NAN(*pfVar27))) {
        __assert_fail("in2.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x12e,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pfVar27 = (float *)Imf_3_4::Header::screenWindowCenter();
      pfVar28 = (float *)Imf_3_4::Header::screenWindowCenter();
      if ((((*pfVar27 != *pfVar28) || (NAN(*pfVar27) || NAN(*pfVar28))) ||
          (pfVar27[1] != pfVar28[1])) || (NAN(pfVar27[1]) || NAN(pfVar28[1]))) {
        __assert_fail("in2.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x130,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pfVar27 = (float *)Imf_3_4::Header::screenWindowWidth();
      fVar2 = *pfVar27;
      pfVar27 = (float *)Imf_3_4::Header::screenWindowWidth();
      if ((fVar2 != *pfVar27) || (NAN(fVar2) || NAN(*pfVar27))) {
        __assert_fail("in2.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x131,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      piVar21 = (int *)Imf_3_4::Header::lineOrder();
      iVar9 = *piVar21;
      piVar21 = (int *)Imf_3_4::Header::lineOrder();
      if (iVar9 != *piVar21) {
        __assert_fail("in2.header ().lineOrder () == hdr.lineOrder ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x132,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      piVar21 = (int *)Imf_3_4::Header::compression();
      iVar9 = *piVar21;
      piVar21 = (int *)Imf_3_4::Header::compression();
      if (iVar9 != *piVar21) {
        __assert_fail("in2.header ().compression () == hdr.compression ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x133,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pCVar29 = (ChannelList *)Imf_3_4::Header::channels();
      pCVar30 = (ChannelList *)Imf_3_4::Header::channels();
      cVar6 = Imf_3_4::ChannelList::operator==(pCVar29,pCVar30);
      if (cVar6 == '\0') {
        __assert_fail("in2.header ().channels () == hdr.channels ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x134,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      for (uVar38 = 0; uVar38 != uVar39; uVar38 = uVar38 + 1) {
        lVar37 = 0;
        for (lVar34 = 0; iVar9 = Imf_3_4::TiledInputFile::levelHeight((int)&in1), lVar34 < iVar9;
            lVar34 = lVar34 + 1) {
          for (lVar31 = 0; iVar9 = Imf_3_4::TiledInputFile::levelWidth((int)&in1), lVar31 < iVar9;
              lVar31 = lVar31 + 1) {
            lVar35 = uVar38 * 0x18;
            fVar2 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)
                                      (*(long *)(ph2._sizeY + 8 + lVar35) * lVar37 +
                                       *(long *)(ph2._sizeY + 0x10 + lVar35) + lVar31 * 2) * 4);
            pfVar27 = (float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)
                                       (*(long *)(ph1_1._sizeY + 8 + lVar35) * lVar37 +
                                        *(long *)(ph1_1._sizeY + 0x10 + lVar35) + lVar31 * 2) * 4);
            if ((fVar2 != *pfVar27) || (NAN(fVar2) || NAN(*pfVar27))) {
              __assert_fail("(levels2[l])[y][x] == (levels1[l])[y][x]",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                            ,0x13a,
                            "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                           );
            }
            if ((iVar17 - 8U < 0xfffffffe) &&
               ((pfVar27 = (float *)(_imath_half_to_float_table +
                                    (ulong)*(ushort *)
                                            (*(long *)(ph1._sizeY + 8 + lVar35) * lVar37 +
                                             *(long *)(ph1._sizeY + 0x10 + lVar35) + lVar31 * 2) * 4
                                    ), fVar2 != *pfVar27 || (NAN(fVar2) || NAN(*pfVar27))))) {
              __assert_fail("(levels2[l])[y][x] == (levels[l])[y][x]",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                            ,0x13d,
                            "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                           );
            }
          }
          lVar37 = lVar37 + 2;
        }
      }
      Imf_3_4::Array<Imf_3_4::Array2D<Imath_3_2::half>_>::~Array
                ((Array<Imf_3_4::Array2D<Imath_3_2::half>_> *)&ph2);
      Imf_3_4::Array<Imf_3_4::Array2D<Imath_3_2::half>_>::~Array
                ((Array<Imf_3_4::Array2D<Imath_3_2::half>_> *)&ph1_1);
      Imf_3_4::TiledInputFile::~TiledInputFile(&in2);
      Imf_3_4::TiledInputFile::~TiledInputFile(&in1);
      remove(_Var4._M_p);
      remove(_Var3._M_p);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      Imf_3_4::Array<Imf_3_4::Array2D<Imath_3_2::half>_>::~Array
                ((Array<Imf_3_4::Array2D<Imath_3_2::half>_> *)&ph1);
      Imf_3_4::Header::~Header(&hdr);
      _Var4 = filename1._M_dataplus;
      _Var3 = filename2._M_dataplus;
      poVar20 = std::operator<<((ostream *)&std::cout,"levelMode 2, ");
      poVar20 = std::operator<<(poVar20,"compression ");
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar17);
      poVar20 = std::operator<<(poVar20,", roundingMode ");
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar16);
      poVar20 = std::operator<<(poVar20,", xOffset ");
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,w);
      poVar20 = std::operator<<(poVar20,", yOffset ");
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,h);
      std::endl<char,std::char_traits<char>>(poVar20);
      _out = 0;
      fb2._map._M_t._M_impl._0_8_ = 0;
      fb._map._M_t._M_impl._0_4_ = w;
      fb._map._M_t._M_impl._4_4_ = h;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var7;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = iVar8;
      Imf_3_4::Header::Header
                (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&fb2,1.0,INCREASING_Y,ZIP_COMPRESSION);
      piVar21 = (int *)Imf_3_4::Header::compression();
      *piVar21 = iVar17;
      puVar22 = (undefined4 *)Imf_3_4::Header::lineOrder();
      *puVar22 = 0;
      pcVar23 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar23,(Channel *)0x1a5faf);
      _out = 0x3700000011;
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      ph1._sizeX = 0;
      ph1._sizeY = 0;
      ph1._data = (half *)0x0;
      std::operator<<((ostream *)&std::cout," writing");
      std::ostream::flush();
      remove(_Var4._M_p);
      iVar9 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&fb2,_Var4._M_p,&hdr,iVar9);
      iVar9 = Imf_3_4::TiledOutputFile::numYLevels();
      iVar10 = Imf_3_4::TiledOutputFile::numXLevels();
      Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::resizeErase
                ((Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *)&ph1,(long)iVar9,(long)iVar10);
      lVar34 = 0;
      local_258 = 0;
      while( true ) {
        iVar9 = Imf_3_4::TiledOutputFile::numYLevels();
        if (iVar9 <= local_258) break;
        lVar31 = 0;
        for (lVar37 = 0; iVar9 = Imf_3_4::TiledOutputFile::numXLevels(), lVar37 < iVar9;
            lVar37 = lVar37 + 1) {
          iVar9 = Imf_3_4::TiledOutputFile::levelWidth((int)&fb2);
          iVar10 = Imf_3_4::TiledOutputFile::levelHeight((int)&fb2);
          Imf_3_4::Array2D<Imath_3_2::half>::resizeErase
                    ((Array2D<Imath_3_2::half> *)
                     ((long)&(ph1._data)->_h + lVar31 + ph1._sizeY * lVar34),(long)iVar10,
                     (long)iVar9);
          fillPixels((Array2D<Imath_3_2::half> *)
                     ((long)&(ph1._data)->_h + lVar31 + ph1._sizeY * lVar34),iVar9,iVar10);
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          Imf_3_4::Slice::Slice
                    ((Slice *)&out,HALF,
                     (char *)(*(long *)((long)&ph1._data[4]._h + ph1._sizeY * lVar34 + lVar31) *
                              lVar18 * 2 +
                              *(long *)((long)&ph1._data[8]._h + ph1._sizeY * lVar34 + lVar31) +
                             lVar19 * 2),2,(long)iVar9 * 2,1,1,0.0,false,false);
          Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1a5faf);
          Imf_3_4::TiledOutputFile::setFrameBuffer(&fb2);
          iVar11 = (int)&fb2;
          iVar9 = Imf_3_4::TiledOutputFile::numXTiles(iVar11);
          iVar10 = Imf_3_4::TiledOutputFile::numYTiles(iVar11);
          Imf_3_4::TiledOutputFile::writeTiles(iVar11,0,iVar9 + -1,0,iVar10 + -1,(int)lVar37);
          std::
          _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                       *)&fb);
          lVar31 = lVar31 + 0x18;
        }
        local_258 = local_258 + 1;
        lVar34 = lVar34 + 0x18;
      }
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fb2);
      std::operator<<((ostream *)&std::cout," copying");
      std::ostream::flush();
      remove(_Var3._M_p);
      iVar9 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&out,_Var4._M_p,iVar9);
      pHVar24 = (Header *)Imf_3_4::InputFile::header();
      iVar9 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&fb,_Var3._M_p,pHVar24,iVar9);
      Imf_3_4::TiledOutputFile::copyPixels((InputFile *)&fb);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fb);
      Imf_3_4::InputFile::~InputFile((InputFile *)&out);
      std::operator<<((ostream *)&std::cout," reading");
      std::ostream::flush();
      iVar9 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile(&in1,_Var4._M_p,iVar9);
      iVar9 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile(&in2,_Var3._M_p,iVar9);
      Imf_3_4::TiledInputFile::header();
      piVar21 = (int *)Imf_3_4::Header::dataWindow();
      iVar9 = *piVar21;
      iVar10 = piVar21[1];
      uVar12 = Imf_3_4::TiledInputFile::numXLevels();
      uVar14 = Imf_3_4::TiledInputFile::numYLevels();
      Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::Array2D
                ((Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *)&ph1_1,(long)(int)uVar14,
                 (long)(int)uVar12);
      Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::Array2D
                ((Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *)&ph2,(long)(int)uVar14,
                 (long)(int)uVar12);
      if ((int)uVar12 < 1) {
        uVar12 = 0;
      }
      uVar39 = (ulong)uVar14;
      if ((int)uVar14 < 1) {
        uVar39 = 0;
      }
      local_258 = 0;
      for (uVar38 = 0; uVar38 != uVar39; uVar38 = uVar38 + 1) {
        iVar11 = 0;
        for (lVar34 = 0; (ulong)uVar12 * 0x18 != lVar34; lVar34 = lVar34 + 0x18) {
          iVar13 = Imf_3_4::TiledInputFile::levelWidth((int)&in2);
          iVar15 = Imf_3_4::TiledInputFile::levelHeight((int)&in2);
          lVar37 = (long)iVar13;
          Imf_3_4::Array2D<Imath_3_2::half>::resizeErase
                    ((Array2D<Imath_3_2::half> *)
                     ((long)&(ph1_1._data)->_h + lVar34 + ph1_1._sizeY * local_258),(long)iVar15,
                     lVar37);
          Imf_3_4::Array2D<Imath_3_2::half>::resizeErase
                    ((Array2D<Imath_3_2::half> *)
                     ((long)&(ph2._data)->_h + lVar34 + ph2._sizeY * local_258),(long)iVar15,lVar37)
          ;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &fb2._map._M_t._M_impl.super__Rb_tree_header._M_header;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          Imf_3_4::Slice::Slice
                    ((Slice *)&out,HALF,
                     (char *)(*(long *)((long)&ph1_1._data[4]._h + ph1_1._sizeY * local_258 + lVar34
                                       ) * -(long)iVar10 * 2 +
                              *(long *)((long)&ph1_1._data[8]._h + ph1_1._sizeY * local_258 + lVar34
                                       ) + (long)iVar9 * -2),2,lVar37 * 2,1,1,0.0,false,false);
          Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1a5faf);
          Imf_3_4::Slice::Slice
                    ((Slice *)&out,HALF,
                     (char *)(*(long *)((long)&ph2._data[4]._h + ph2._sizeY * local_258 + lVar34) *
                              -(long)iVar10 * 2 +
                              *(long *)((long)&ph2._data[8]._h + ph2._sizeY * local_258 + lVar34) +
                             (long)iVar9 * -2),2,lVar37 * 2,1,1,0.0,false,false);
          Imf_3_4::FrameBuffer::insert((char *)&fb2,(Slice *)0x1a5faf);
          Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&in1);
          Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&in2);
          iVar13 = Imf_3_4::TiledInputFile::numXTiles((int)&in1);
          iVar15 = Imf_3_4::TiledInputFile::numYTiles((int)&in1);
          Imf_3_4::TiledInputFile::readTiles((int)&in1,0,iVar13 + -1,0,iVar15 + -1,iVar11);
          iVar13 = Imf_3_4::TiledInputFile::numXTiles((int)&in2);
          iVar15 = Imf_3_4::TiledInputFile::numYTiles((int)&in2);
          Imf_3_4::TiledInputFile::readTiles((int)&in2,0,iVar13 + -1,0,iVar15 + -1,iVar11);
          std::
          _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                       *)&fb2);
          std::
          _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                       *)&fb);
          iVar11 = iVar11 + 1;
        }
        local_258 = local_258 + 0x18;
      }
      std::operator<<((ostream *)&std::cout," comparing");
      std::ostream::flush();
      Imf_3_4::TiledInputFile::header();
      pBVar25 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
      pBVar26 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
      bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar25,pBVar26);
      if (!bVar5) {
        __assert_fail("in2.header ().displayWindow () == hdr.displayWindow ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1da,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pBVar25 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
      pBVar26 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
      bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar25,pBVar26);
      if (!bVar5) {
        __assert_fail("in2.header ().dataWindow () == hdr.dataWindow ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1db,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pfVar27 = (float *)Imf_3_4::Header::pixelAspectRatio();
      fVar2 = *pfVar27;
      pfVar27 = (float *)Imf_3_4::Header::pixelAspectRatio();
      if ((fVar2 != *pfVar27) || (NAN(fVar2) || NAN(*pfVar27))) {
        __assert_fail("in2.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1dc,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pfVar27 = (float *)Imf_3_4::Header::screenWindowCenter();
      pfVar28 = (float *)Imf_3_4::Header::screenWindowCenter();
      if ((((*pfVar27 != *pfVar28) || (NAN(*pfVar27) || NAN(*pfVar28))) ||
          (pfVar27[1] != pfVar28[1])) || (NAN(pfVar27[1]) || NAN(pfVar28[1]))) {
        __assert_fail("in2.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1de,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pfVar27 = (float *)Imf_3_4::Header::screenWindowWidth();
      fVar2 = *pfVar27;
      pfVar27 = (float *)Imf_3_4::Header::screenWindowWidth();
      if ((fVar2 != *pfVar27) || (NAN(fVar2) || NAN(*pfVar27))) {
        __assert_fail("in2.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1df,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      piVar21 = (int *)Imf_3_4::Header::lineOrder();
      iVar9 = *piVar21;
      piVar21 = (int *)Imf_3_4::Header::lineOrder();
      if (iVar9 != *piVar21) {
        __assert_fail("in2.header ().lineOrder () == hdr.lineOrder ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1e0,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      piVar21 = (int *)Imf_3_4::Header::compression();
      iVar9 = *piVar21;
      piVar21 = (int *)Imf_3_4::Header::compression();
      if (iVar9 != *piVar21) {
        __assert_fail("in2.header ().compression () == hdr.compression ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1e1,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pCVar29 = (ChannelList *)Imf_3_4::Header::channels();
      pCVar30 = (ChannelList *)Imf_3_4::Header::channels();
      cVar6 = Imf_3_4::ChannelList::operator==(pCVar29,pCVar30);
      if (cVar6 == '\0') {
        __assert_fail("in2.header ().channels () == hdr.channels ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1e2,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      for (uVar38 = 0; uVar38 != uVar39; uVar38 = uVar38 + 1) {
        for (uVar36 = 0; uVar36 != uVar12; uVar36 = uVar36 + 1) {
          lVar37 = 0;
          for (lVar34 = 0; iVar9 = Imf_3_4::TiledInputFile::levelHeight((int)&in1), lVar34 < iVar9;
              lVar34 = lVar34 + 1) {
            for (lVar31 = 0; iVar9 = Imf_3_4::TiledInputFile::levelWidth((int)&in1), lVar31 < iVar9;
                lVar31 = lVar31 + 1) {
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)
                                        (*(long *)(ph2._data +
                                                  ph2._sizeY * uVar38 * 0xc + uVar36 * 0xc + 4) *
                                         lVar37 + *(long *)(ph2._data +
                                                           ph2._sizeY * uVar38 * 0xc +
                                                           uVar36 * 0xc + 8) + lVar31 * 2) * 4);
              pfVar27 = (float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)
                                         (*(long *)(ph1_1._data +
                                                   ph1_1._sizeY * uVar38 * 0xc + uVar36 * 0xc + 4) *
                                          lVar37 + *(long *)(ph1_1._data +
                                                            ph1_1._sizeY * uVar38 * 0xc +
                                                            uVar36 * 0xc + 8) + lVar31 * 2) * 4);
              if ((fVar2 != *pfVar27) || (NAN(fVar2) || NAN(*pfVar27))) {
                __assert_fail("(levels2[ly][lx])[y][x] == (levels1[ly][lx])[y][x]",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                              ,0x1ea,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                             );
              }
              if ((iVar17 - 8U < 0xfffffffe) &&
                 ((pfVar27 = (float *)(_imath_half_to_float_table +
                                      (ulong)*(ushort *)
                                              (*(long *)(ph1._data +
                                                        ph1._sizeY * uVar38 * 0xc + uVar36 * 0xc + 4
                                                        ) * lVar37 +
                                               *(long *)(ph1._data +
                                                        ph1._sizeY * uVar38 * 0xc + uVar36 * 0xc + 8
                                                        ) + lVar31 * 2) * 4), fVar2 != *pfVar27 ||
                  (NAN(fVar2) || NAN(*pfVar27))))) {
                __assert_fail("(levels2[ly][lx])[y][x] == (levels[ly][lx])[y][x]",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                              ,0x1ef,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                             );
              }
            }
            lVar37 = lVar37 + 2;
          }
        }
      }
      Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::~Array2D
                ((Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *)&ph2);
      Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::~Array2D
                ((Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *)&ph1_1);
      Imf_3_4::TiledInputFile::~TiledInputFile(&in2);
      Imf_3_4::TiledInputFile::~TiledInputFile(&in1);
      remove(_Var4._M_p);
      remove(_Var3._M_p);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::~Array2D
                ((Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *)&ph1);
      Imf_3_4::Header::~Header(&hdr);
    }
    iVar17 = iVar17 + 1;
  } while( true );
}

Assistant:

void
writeCopyRead (
    const std::string& tempDir, int w, int h, int xs, int ys, int dx, int dy)
{
    std::string filename1 = tempDir + "imf_test_copy1.exr";
    std::string filename2 = tempDir + "imf_test_copy2.exr";

    for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
    {
        for (int rmode = 0; rmode < NUM_ROUNDINGMODES; ++rmode)
        {
            writeCopyReadONE (
                filename1.c_str (),
                filename2.c_str (),
                w,
                h,
                xs,
                ys,
                dx,
                dy,
                Compression (comp),
                LevelRoundingMode (rmode));

            writeCopyReadMIP (
                filename1.c_str (),
                filename2.c_str (),
                w,
                h,
                xs,
                ys,
                dx,
                dy,
                Compression (comp),
                LevelRoundingMode (rmode));

            writeCopyReadRIP (
                filename1.c_str (),
                filename2.c_str (),
                w,
                h,
                xs,
                ys,
                dx,
                dy,
                Compression (comp),
                LevelRoundingMode (rmode));
        }
    }
}